

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remote_server.cpp
# Opt level: O1

void ServerRegisterHandlers(Remote_evpath_state *ev_state)

{
  CMregister_handler(ev_state->OpenFileFormat,OpenHandler,ev_state);
  CMregister_handler(ev_state->OpenSimpleFileFormat,OpenSimpleHandler,ev_state);
  CMregister_handler(ev_state->GetRequestFormat,GetRequestHandler,ev_state);
  CMregister_handler(ev_state->ReadRequestFormat,ReadRequestHandler,ev_state);
  CMregister_handler(ev_state->KillServerFormat,KillServerHandler,ev_state);
  CMregister_handler(ev_state->KillResponseFormat,KillResponseHandler,ev_state);
  CMregister_handler(ev_state->StatusServerFormat,StatusServerHandler,ev_state);
  CMregister_handler(ev_state->StatusResponseFormat,StatusResponseHandler,ev_state);
  return;
}

Assistant:

void ServerRegisterHandlers(struct Remote_evpath_state &ev_state)
{
    CMregister_handler(ev_state.OpenFileFormat, OpenHandler, &ev_state);
    CMregister_handler(ev_state.OpenSimpleFileFormat, OpenSimpleHandler, &ev_state);
    CMregister_handler(ev_state.GetRequestFormat, GetRequestHandler, &ev_state);
    CMregister_handler(ev_state.ReadRequestFormat, ReadRequestHandler, &ev_state);
    CMregister_handler(ev_state.KillServerFormat, KillServerHandler, &ev_state);
    CMregister_handler(ev_state.KillResponseFormat, KillResponseHandler, &ev_state);
    CMregister_handler(ev_state.StatusServerFormat, StatusServerHandler, &ev_state);
    CMregister_handler(ev_state.StatusResponseFormat, StatusResponseHandler, &ev_state);
}